

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_q4_0(block_q4_0 *x,float *y,int64_t k)

{
  byte bVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  int x1;
  int x0;
  int j;
  float d;
  int i;
  int nb;
  undefined4 local_28;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < (int)(in_RDX / 0x20); local_20 = local_20 + 1) {
    fVar2 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_20 * 0x12));
    for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
      bVar1 = *(byte *)(in_RDI + (long)local_20 * 0x12 + 2 + (long)local_28);
      *(float *)(in_RSI + (long)(local_20 * 0x20 + local_28) * 4) =
           (float)(int)((*(byte *)(in_RDI + (long)local_20 * 0x12 + 2 + (long)local_28) & 0xf) - 8)
           * fVar2;
      *(float *)(in_RSI + (long)(local_20 * 0x20 + local_28 + 0x10) * 4) =
           (float)(((int)(uint)bVar1 >> 4) + -8) * fVar2;
    }
  }
  return;
}

Assistant:

void dequantize_row_q4_0(const block_q4_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK4_0;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int j = 0; j < qk/2; ++j) {
            const int x0 = (x[i].qs[j] & 0x0F) - 8;
            const int x1 = (x[i].qs[j] >>   4) - 8;

            y[i*qk + j + 0   ] = x0*d;
            y[i*qk + j + qk/2] = x1*d;
        }
    }
}